

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# L2NormCost.cpp
# Opt level: O0

void __thiscall
iDynTree::optimalcontrol::L2NormCost::L2NormCost
          (L2NormCost *this,string *name,IndexRange *stateSelector,uint totalStateDimension,
          IndexRange *controlSelector,uint totalControlDimension)

{
  byte bVar1;
  IndexRange *selectedRange;
  int in_ECX;
  undefined8 *in_RDI;
  int in_R9D;
  string *in_stack_ffffffffffffff98;
  undefined6 in_stack_ffffffffffffffa0;
  undefined1 in_stack_ffffffffffffffa6;
  undefined1 in_stack_ffffffffffffffa7;
  L2NormCostImplementation *this_00;
  uint totalDimension;
  CostAttributes *in_stack_ffffffffffffffc0;
  
  Cost::Cost((Cost *)CONCAT17(in_stack_ffffffffffffffa7,
                              CONCAT16(in_stack_ffffffffffffffa6,in_stack_ffffffffffffffa0)),
             in_stack_ffffffffffffff98);
  *in_RDI = &PTR__L2NormCost_003fae90;
  this_00 = (L2NormCostImplementation *)(in_RDI + 5);
  selectedRange = (IndexRange *)operator_new(0x250);
  L2NormCostImplementation::L2NormCostImplementation(this_00);
  *(IndexRange **)&this_00->stateCost = selectedRange;
  bVar1 = iDynTree::IndexRange::isValid();
  totalDimension = (uint)((ulong)this_00 >> 0x20);
  if (((bVar1 & 1) != 0) && (in_ECX != 0)) {
    CostAttributes::initializeCost(in_stack_ffffffffffffffc0,selectedRange,totalDimension);
  }
  bVar1 = iDynTree::IndexRange::isValid();
  if (((bVar1 & 1) != 0) && (in_R9D != 0)) {
    CostAttributes::initializeCost(in_stack_ffffffffffffffc0,selectedRange,totalDimension);
  }
  return;
}

Assistant:

L2NormCost::L2NormCost(const std::string &name, const IndexRange &stateSelector, unsigned int totalStateDimension, const IndexRange &controlSelector, unsigned int totalControlDimension)
            : Cost (name)
            , m_pimpl(new L2NormCostImplementation)
        {
            if (stateSelector.isValid() && totalStateDimension > 0) {
                m_pimpl->stateCost.initializeCost(stateSelector, totalStateDimension);

            }

            if (controlSelector.isValid() && totalControlDimension > 0) {
                m_pimpl->controlCost.initializeCost(controlSelector, totalControlDimension);

            }
        }